

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

StackSym * __thiscall
BackwardPass::ProcessByteCodeUsesDst(BackwardPass *this,ByteCodeUsesInstr *byteCodeUsesInstr)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  BackwardPass *this_01;
  BackwardPass *sym;
  char *this_02;
  
  bVar2 = DoByteCodeUpwardExposedUsed(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x7cd,"(this->DoByteCodeUpwardExposedUsed())",
                       "this->DoByteCodeUpwardExposedUsed()");
    if (!bVar2) goto LAB_003c750c;
    *puVar4 = 0;
  }
  this_00 = (byteCodeUsesInstr->super_Instr).m_dst;
  if (this_00 == (Opnd *)0x0) {
LAB_003c74e5:
    sym = (BackwardPass *)0x0;
  }
  else {
    pRVar5 = IR::Opnd::AsRegOpnd(this_00);
    this_01 = (BackwardPass *)Sym::AsStackSym(&pRVar5->m_sym->super_Sym);
    if (((pRVar5->super_Opnd).field_0xb & 8) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x7d3,"(!dstRegOpnd->GetIsJITOptimizedReg())",
                         "!dstRegOpnd->GetIsJITOptimizedReg()");
      if (!bVar2) goto LAB_003c750c;
      *puVar4 = 0;
    }
    this_02 = (char *)this_01;
    RVar3 = StackSym::GetByteCodeRegSlot((StackSym *)this_01);
    if (RVar3 == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      this_02 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
      ;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x7d4,"(dstStackSym->GetByteCodeRegSlot() != Js::Constants::NoRegister)",
                         "dstStackSym->GetByteCodeRegSlot() != Js::Constants::NoRegister");
      if (!bVar2) {
LAB_003c750c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    sym = this_01;
    if (this_01->field_0x1c != TyVar) {
      sym = (BackwardPass *)StackSym::GetVarEquivSym((StackSym *)this_01,(Func *)0x0);
      this_02 = (char *)this_01;
    }
    if (this->currentRegion != (Region *)0x0) {
      bVar2 = CheckWriteThroughSymInRegion
                        ((BackwardPass *)this_02,this->currentRegion,(StackSym *)sym);
      if (bVar2) goto LAB_003c74e5;
    }
    BVSparse<Memory::JitArenaAllocator>::Clear
              (this->currentBlock->byteCodeUpwardExposedUsed,*(BVIndex *)&sym->tempAlloc);
  }
  return (StackSym *)sym;
}

Assistant:

StackSym*
BackwardPass::ProcessByteCodeUsesDst(IR::ByteCodeUsesInstr * byteCodeUsesInstr)
{
    Assert(this->DoByteCodeUpwardExposedUsed());
    IR::Opnd * dst = byteCodeUsesInstr->GetDst();
    if (dst)
    {
        IR::RegOpnd * dstRegOpnd = dst->AsRegOpnd();
        StackSym * dstStackSym = dstRegOpnd->m_sym->AsStackSym();
        Assert(!dstRegOpnd->GetIsJITOptimizedReg());
        Assert(dstStackSym->GetByteCodeRegSlot() != Js::Constants::NoRegister);
        if (dstStackSym->GetType() != TyVar)
        {
            dstStackSym = dstStackSym->GetVarEquivSym(nullptr);
        }

        // If the current region is a Try, symbols in its write-through set shouldn't be cleared.
        // Otherwise, symbols in the write-through set of the first try ancestor shouldn't be cleared.
        if (!this->currentRegion ||
            !this->CheckWriteThroughSymInRegion(this->currentRegion, dstStackSym))
        {
            this->currentBlock->byteCodeUpwardExposedUsed->Clear(dstStackSym->m_id);
            return dstStackSym;

        }
    }
    return nullptr;
}